

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O0

void __thiscall higan::Logger::~Logger(Logger *this)

{
  char *pcVar1;
  size_t __args_1;
  Logger *this_local;
  
  pcVar1 = TinyBuffer::WriteBegin(&this->buffer_);
  *pcVar1 = '\n';
  TinyBuffer::AddWriteIndex(&this->buffer_,1);
  pcVar1 = TinyBuffer::ReadBegin(&this->buffer_);
  __args_1 = TinyBuffer::ReadableSize(&this->buffer_);
  std::function<void_(const_char_*,_unsigned_long)>::operator()(&g_output_func,pcVar1,__args_1);
  if (this->level_ == FATAL) {
    std::function<void_()>::operator()(&g_flush_func);
    abort();
  }
  TinyBuffer::~TinyBuffer(&this->buffer_);
  return;
}

Assistant:

Logger::~Logger()
{
	*buffer_.WriteBegin() = '\n';
	buffer_.AddWriteIndex(1);

	g_output_func(buffer_.ReadBegin(), buffer_.ReadableSize());

	if (level_ == FATAL)
	{
		g_flush_func();
		abort();
	}
}